

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_shaders.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_shaders::load_textures_v5(xr_level_shaders *this,xr_reader *r)

{
  uint *puVar1;
  pointer pbVar2;
  char *__s;
  char *pcVar3;
  ulong __new_size;
  pointer pbVar4;
  pointer pbVar5;
  
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  __new_size = (ulong)*puVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_textures,__new_size);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_lightmaps0,__new_size);
  pbVar4 = (this->m_textures).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_textures).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    pbVar5 = (this->m_lightmaps0).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __s = xr_reader::skip_sz(r);
      pcVar3 = strchr(__s,0x2c);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = (char *)pbVar4->_M_string_length;
        strlen(__s);
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)pbVar5,0,(char *)pbVar5->_M_string_length,(ulong)__s);
        __s = pcVar3 + 1;
        pcVar3 = (char *)pbVar4->_M_string_length;
        strlen(__s);
      }
      std::__cxx11::string::_M_replace((ulong)pbVar4,0,pcVar3,(ulong)__s);
      pbVar4 = pbVar4 + 1;
      pbVar5 = pbVar5 + 1;
    } while (pbVar4 != pbVar2);
  }
  return;
}

Assistant:

void xr_level_shaders::load_textures_v5(xr_reader& r)
{
	size_t n = r.r_u32();
	m_textures.resize(n);
	m_lightmaps0.resize(n);
	for (std::vector<std::string>::iterator it = m_textures.begin(),
			lm0_it = m_lightmaps0.begin(), end = m_textures.end();
			it != end; ++it, ++lm0_it) {
		const char* raw = r.skip_sz();
		if (const char* comma = std::strchr(raw, ',')) {
			lm0_it->assign(raw, comma - raw);
			*it = comma + 1;
		} else {
			*it = raw;
		}
	}
}